

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namespace_printer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::NamespacePrinterTest_DifferentDelim_Test::TestBody
          (NamespacePrinterTest_DifferentDelim_Test *this)

{
  ZeroCopyOutputStream *output;
  char *message;
  char *in_R9;
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_201;
  AssertHelper local_200;
  Message local_1f8;
  NamespacePrinter namespace_printer;
  AssertionResult gtest_ar_;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  string local_188 [32];
  string local_168 [32];
  Printer printer;
  
  output = NamespacePrinterTest::output(&this->super_NamespacePrinterTest);
  io::Printer::Printer(&printer,output,'\0',(AnnotationCollector *)0x0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"A",(allocator<char> *)&gtest_ar_);
  std::__cxx11::string::string<std::allocator<char>>(local_188,"B",(allocator<char> *)&local_1f8);
  std::__cxx11::string::string<std::allocator<char>>(local_168,"E",(allocator<char> *)&local_200);
  __l._M_len = 3;
  __l._M_array = &local_1a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1c0,__l,&local_201);
  NamespacePrinter::NamespacePrinter(&namespace_printer,&printer,&local_1c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c0);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&local_1a8._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  gtest_ar_.success_ = (bool)(printer.failed_ ^ 1);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (printer.failed_ != false) {
    testing::Message::Message(&local_1f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1a8,(internal *)&gtest_ar_,(AssertionResult *)"printer.failed()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/namespace_printer_unittest.cc"
               ,0x3c,local_1a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    std::__cxx11::string::~string((string *)&local_1a8);
    if (local_1f8.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_1f8.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  NamespacePrinter::~NamespacePrinter(&namespace_printer);
  io::Printer::~Printer(&printer);
  if ((this->super_NamespacePrinterTest).stream_.
      super__Optional_base<google::protobuf::io::StringOutputStream,_false,_false>._M_payload.
      super__Optional_payload<google::protobuf::io::StringOutputStream,_true,_false,_false>.
      super__Optional_payload_base<google::protobuf::io::StringOutputStream>._M_engaged == true) {
    (this->super_NamespacePrinterTest).stream_.
    super__Optional_base<google::protobuf::io::StringOutputStream,_false,_false>._M_payload.
    super__Optional_payload<google::protobuf::io::StringOutputStream,_true,_false,_false>.
    super__Optional_payload_base<google::protobuf::io::StringOutputStream>._M_engaged = false;
  }
  local_1a8._M_string_length = (size_type)(this->super_NamespacePrinterTest).out_._M_dataplus._M_p;
  local_1a8._M_dataplus._M_p = (pointer)(this->super_NamespacePrinterTest).out_._M_string_length;
  testing::internal::CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,char[98]>
            ((internal *)&printer,"written()",
             "\"namespace A {\\n\" \"namespace B {\\n\" \"namespace E {\\n\" \"\\n\" \"}  // namespace E\\n\" \"}  // namespace B\\n\" \"}  // namespace A\\n\""
             ,(basic_string_view<char,_std::char_traits<char>_> *)&local_1a8,
             (char (*) [98])
             "namespace A {\nnamespace B {\nnamespace E {\n\n}  // namespace E\n}  // namespace B\n}  // namespace A\n"
            );
  if ((char)printer.sink_.stream_ == '\0') {
    testing::Message::Message((Message *)&local_1a8);
    if (printer.sink_.buffer_ == (void *)0x0) {
      message = anon_var_dwarf_651463 + 5;
    }
    else {
      message = *printer.sink_.buffer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&namespace_printer,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/namespace_printer_unittest.cc"
               ,0x46,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&namespace_printer,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&namespace_printer);
    if ((long *)local_1a8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1a8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&printer.sink_.buffer_);
  return;
}

Assistant:

TEST_F(NamespacePrinterTest, DifferentDelim) {
  {
    io::Printer printer(output(), '\0');

    const NamespacePrinter namespace_printer(&printer, {"A", "B", "E"});

    EXPECT_FALSE(printer.failed());
  }

  EXPECT_EQ(written(),
            "namespace A {\n"
            "namespace B {\n"
            "namespace E {\n"
            "\n"
            "}  // namespace E\n"
            "}  // namespace B\n"
            "}  // namespace A\n");
}